

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Module * sqlite3VtabCreateModule
                   (sqlite3 *db,char *zName,sqlite3_module *pModule,void *pAux,
                   _func_void_void_ptr *xDestroy)

{
  size_t sVar1;
  Module *data;
  void *p;
  uint uVar2;
  Module *pKey;
  
  if (zName == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    sVar1 = strlen(zName);
    uVar2 = (uint)sVar1 & 0x3fffffff;
  }
  data = (Module *)sqlite3Malloc((ulong)(uVar2 + 0x29));
  if (data == (Module *)0x0) {
    sqlite3OomFault(db);
  }
  else {
    pKey = data + 1;
    memcpy(pKey,zName,(ulong)(uVar2 + 1));
    data->zName = (char *)pKey;
    data->pModule = pModule;
    data->pAux = pAux;
    data->xDestroy = xDestroy;
    data->pEpoTab = (Table *)0x0;
    p = sqlite3HashInsert(&db->aModule,(char *)pKey,data);
    if (p == (void *)0x0) {
      return data;
    }
    sqlite3OomFault(db);
    sqlite3DbFreeNN(db,p);
  }
  return (Module *)0x0;
}

Assistant:

SQLITE_PRIVATE Module *sqlite3VtabCreateModule(
  sqlite3 *db,                    /* Database in which module is registered */
  const char *zName,              /* Name assigned to this module */
  const sqlite3_module *pModule,  /* The definition of the module */
  void *pAux,                     /* Context pointer for xCreate/xConnect */
  void (*xDestroy)(void *)        /* Module destructor function */
){
  Module *pMod;
  int nName = sqlite3Strlen30(zName);
  pMod = (Module *)sqlite3Malloc(sizeof(Module) + nName + 1);
  if( pMod==0 ){
    sqlite3OomFault(db);
  }else{
    Module *pDel;
    char *zCopy = (char *)(&pMod[1]);
    memcpy(zCopy, zName, nName+1);
    pMod->zName = zCopy;
    pMod->pModule = pModule;
    pMod->pAux = pAux;
    pMod->xDestroy = xDestroy;
    pMod->pEpoTab = 0;
    pDel = (Module *)sqlite3HashInsert(&db->aModule,zCopy,(void*)pMod);
    assert( pDel==0 || pDel==pMod );
    if( pDel ){
      sqlite3OomFault(db);
      sqlite3DbFree(db, pDel);
      pMod = 0;
    }
  }
  return pMod;
}